

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O3

RealType __thiscall OpenMD::Thermo::getRotationalKinetic(Thermo *this)

{
  double *pdVar1;
  int iVar2;
  StuntDouble *pSVar3;
  long lVar4;
  undefined1 auVar5 [16];
  Molecule *pMVar6;
  ulong uVar7;
  ulong uVar8;
  pointer ppSVar9;
  Snapshot *this_00;
  double dVar10;
  RealType RVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  MoleculeIterator miter;
  Mat3x3d I;
  double local_a8 [4];
  Snapshot *local_88;
  MoleculeIterator local_80;
  double local_78 [9];
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasRotationalKineticEnergy == false) {
    local_80._M_node = (_Base_ptr)0x0;
    local_78[8] = 0.0;
    local_78[6] = 0.0;
    local_78[7] = 0.0;
    local_78[4] = 0.0;
    local_78[5] = 0.0;
    local_78[2] = 0.0;
    local_78[3] = 0.0;
    local_78[0] = 0.0;
    local_78[1] = 0.0;
    pMVar6 = SimInfo::beginMolecule(this->info_,&local_80);
    if (pMVar6 == (Molecule *)0x0) {
      dVar10 = 0.0;
    }
    else {
      dVar10 = 0.0;
      local_88 = this_00;
      do {
        ppSVar9 = (pMVar6->integrableObjects_).
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (ppSVar9 !=
            (pMVar6->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar3 = *ppSVar9;
          while (pSVar3 != (StuntDouble *)0x0) {
            ppSVar9 = ppSVar9 + 1;
            if (pSVar3->objType_ - otDAtom < 2) {
              lVar4 = *(long *)((long)&(pSVar3->snapshotMan_->currentSnapshot_->atomData).
                                       angularMomentum.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + pSVar3->storage_)
              ;
              local_a8[2] = *(double *)(lVar4 + 0x10 + (long)pSVar3->localIndex_ * 0x18);
              pdVar1 = (double *)(lVar4 + (long)pSVar3->localIndex_ * 0x18);
              local_a8[0] = *pdVar1;
              local_a8[1] = pdVar1[1];
              (*pSVar3->_vptr_StuntDouble[5])(local_78,pSVar3);
              if (pSVar3->linear_ == true) {
                iVar2 = pSVar3->linearAxis_;
                uVar8 = (ulong)(((iVar2 + 1) / 3) * -3 + iVar2 + 1);
                uVar7 = (ulong)(iVar2 + ((iVar2 + 2) / 3) * -3 + 2);
                auVar12._0_8_ = local_a8[uVar8] * local_a8[uVar8];
                auVar12._8_8_ = local_a8[uVar7] * local_a8[uVar7];
                auVar5._8_8_ = local_78[uVar7 * 4];
                auVar5._0_8_ = local_78[uVar8 * 4];
                auVar13 = divpd(auVar12,auVar5);
                dVar10 = dVar10 + auVar13._8_8_ + auVar13._0_8_;
              }
              else {
                auVar14._0_8_ = local_a8[0] * local_a8[0];
                auVar14._8_8_ = local_a8[2] * local_a8[2];
                auVar13._8_8_ = local_78[8];
                auVar13._0_8_ = local_78[0];
                auVar13 = divpd(auVar14,auVar13);
                dVar10 = dVar10 + auVar13._8_8_ +
                                  (local_a8[1] * local_a8[1]) / local_78[4] + auVar13._0_8_;
              }
            }
            if (ppSVar9 ==
                (pMVar6->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) break;
            pSVar3 = *ppSVar9;
          }
        }
        pMVar6 = SimInfo::nextMolecule(this->info_,&local_80);
      } while (pMVar6 != (Molecule *)0x0);
      dVar10 = dVar10 * 0.5;
      this_00 = local_88;
    }
    Snapshot::setRotationalKineticEnergy(this_00,dVar10 / 0.0004184);
  }
  RVar11 = Snapshot::getRotationalKineticEnergy(this_00);
  return RVar11;
}

Assistant:

RealType Thermo::getRotationalKinetic() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasRotationalKineticEnergy) {
      SimInfo::MoleculeIterator miter;
      vector<StuntDouble*>::iterator iiter;
      Molecule* mol;
      StuntDouble* sd;
      Vector3d angMom;
      Mat3x3d I;
      int i, j, k;
      RealType kinetic(0.0);

      for (mol = info_->beginMolecule(miter); mol != NULL;
           mol = info_->nextMolecule(miter)) {
        for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
             sd = mol->nextIntegrableObject(iiter)) {
          if (sd->isDirectional()) {
            angMom = sd->getJ();
            I      = sd->getI();

            if (sd->isLinear()) {
              i = sd->linearAxis();
              j = (i + 1) % 3;
              k = (i + 2) % 3;
              kinetic += angMom[j] * angMom[j] / I(j, j) +
                         angMom[k] * angMom[k] / I(k, k);
            } else {
              kinetic += angMom[0] * angMom[0] / I(0, 0) +
                         angMom[1] * angMom[1] / I(1, 1) +
                         angMom[2] * angMom[2] / I(2, 2);
            }
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &kinetic, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      kinetic = kinetic * 0.5 / Constants::energyConvert;

      snap->setRotationalKineticEnergy(kinetic);
    }
    return snap->getRotationalKineticEnergy();
  }